

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::BloomFilterHeader::BloomFilterHeader(BloomFilterHeader *this)

{
  _BloomFilterAlgorithm__isset *p_Var1;
  _BloomFilterHash__isset *p_Var2;
  _BloomFilterCompression__isset *p_Var3;
  
  *(undefined ***)this = &PTR__BloomFilterHeader_017bb798;
  this->numBytes = 0;
  *(undefined ***)&this->algorithm = &PTR__BloomFilterAlgorithm_017bb590;
  (this->algorithm).BLOCK = (SplitBlockAlgorithm)&PTR__SplitBlockAlgorithm_017bb528;
  p_Var1 = &(this->algorithm).__isset;
  *p_Var1 = (_BloomFilterAlgorithm__isset)((byte)*p_Var1 & 0xfe);
  *(undefined ***)&this->hash = &PTR__BloomFilterHash_017bb660;
  (this->hash).XXHASH = (XxHash)&PTR__XxHash_017bb5f8;
  p_Var2 = &(this->hash).__isset;
  *p_Var2 = (_BloomFilterHash__isset)((byte)*p_Var2 & 0xfe);
  *(undefined ***)&this->compression = &PTR__BloomFilterCompression_017bb730;
  (this->compression).UNCOMPRESSED = (Uncompressed)&PTR__Uncompressed_017bb6c8;
  p_Var3 = &(this->compression).__isset;
  *p_Var3 = (_BloomFilterCompression__isset)((byte)*p_Var3 & 0xfe);
  return;
}

Assistant:

BloomFilterHeader::BloomFilterHeader() noexcept
   : numBytes(0) {
}